

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

Status * __thiscall
draco::ObjDecoder::DecodeFromFile
          (Status *__return_storage_ptr__,ObjDecoder *this,string *file_name,
          PointCloud *out_point_cloud)

{
  bool bVar1;
  vector<char,_std::allocator<char>_> buffer;
  allocator<char> local_59;
  _Vector_base<char,_std::allocator<char>_> local_58;
  string local_40 [32];
  
  local_58._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = ReadFileToBuffer(file_name,(vector<char,_std::allocator<char>_> *)&local_58);
  if (bVar1) {
    DecoderBuffer::Init(&this->buffer_,local_58._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58._M_impl.super__Vector_impl_data._M_start);
    this->out_point_cloud_ = out_point_cloud;
    std::__cxx11::string::_M_assign((string *)&this->input_file_name_);
    DecodeInternal(__return_storage_ptr__,this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"Unable to read input file.",&local_59);
    __return_storage_ptr__->code_ = DRACO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Status ObjDecoder::DecodeFromFile(const std::string &file_name,
                                  PointCloud *out_point_cloud) {
  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  buffer_.Init(buffer.data(), buffer.size());

  out_point_cloud_ = out_point_cloud;
  input_file_name_ = file_name;
  return DecodeInternal();
}